

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_unittest.h
# Opt level: O2

void __thiscall
google::protobuf::internal::gtest_suite_WireFormatInvalidInputTest_::
InvalidMessageWithExtraZero<proto2_unittest::TestAllTypes>::InvalidMessageWithExtraZero
          (InvalidMessageWithExtraZero<proto2_unittest::TestAllTypes> *this)

{
  WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>::WireFormatInvalidInputTest
            (&this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>);
  (this->super_WireFormatInvalidInputTest<proto2_unittest::TestAllTypes>).super_Test._vptr_Test =
       (_func_int **)&PTR__Test_016430b8;
  return;
}

Assistant:

TYPED_TEST_P(WireFormatInvalidInputTest, InvalidMessageWithExtraZero) {
  std::string data;
  {
    // Serialize a valid proto
    typename TestFixture::TestAllTypes message;
    message.set_optional_int32(1);
    message.SerializeToString(&data);
    data.push_back(0);  // Append invalid zero tag
  }

  // Control case.
  {
    io::ArrayInputStream ais(data.data(), data.size());
    io::CodedInputStream is(&ais);
    typename TestFixture::TestAllTypes message;
    // It should fail but currently passes.
    EXPECT_TRUE(message.MergePartialFromCodedStream(&is));
    // Parsing from the string should fail.
    EXPECT_FALSE(message.ParseFromString(data));
  }
}